

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_ND_C.cpp
# Opt level: O0

void amrex::EB2::intercept_to_edge_centroid
               (Array4<double> *excent,Array4<double> *eycent,Array4<double> *ezcent,
               Array4<const_unsigned_int> *fx,Array4<const_unsigned_int> *fy,
               Array4<const_unsigned_int> *fz,Array4<const_double> *levset,GpuArray<double,_3U> *dx,
               GpuArray<double,_3U> *problo)

{
  bool bVar1;
  double *pdVar2;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  long *in_R9;
  long *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  Real zcut;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Box zbx;
  iterator __end2_2;
  iterator __begin2_2;
  range_impl<amrex::Box> *__range2_2;
  Real ycut;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Box ybx;
  iterator __end2_1;
  iterator __begin2_1;
  range_impl<amrex::Box> *__range2_1;
  Real xcut;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box xbx;
  iterator __end2;
  iterator __begin2;
  range_impl<amrex::Box> *__range2;
  Real dzinv;
  Real dyinv;
  Real dxinv;
  Array4<double> *in_stack_fffffffffffff738;
  range_impl<amrex::Box> *in_stack_fffffffffffff740;
  double local_880;
  double local_878;
  double local_870;
  int local_864;
  int local_860;
  int local_85c;
  undefined8 local_844;
  int local_83c;
  int local_828;
  int iStack_824;
  Box local_81c;
  iterator local_800;
  iterator local_7e8 [2];
  undefined1 local_7b0 [40];
  undefined1 *local_788;
  double local_780;
  double local_778;
  double local_770;
  int local_764;
  int local_760;
  int local_75c;
  undefined8 local_744;
  int local_73c;
  int local_728;
  int iStack_724;
  Box local_71c;
  iterator local_700;
  iterator local_6e8 [2];
  undefined1 local_6b0 [40];
  undefined1 *local_688;
  double local_680;
  double local_678;
  double local_670;
  int local_664;
  int local_660;
  int local_65c;
  undefined8 local_644;
  int local_63c;
  int local_628;
  int iStack_624;
  Box local_61c;
  iterator local_600;
  iterator local_5e8 [2];
  undefined1 local_5b0 [40];
  undefined1 *local_588;
  double local_580;
  double local_578;
  double local_570;
  long *local_568;
  long *local_560;
  long *local_558;
  long *local_550;
  long *local_548;
  long *local_540;
  undefined4 local_534;
  undefined4 local_524;
  double *local_520;
  undefined4 local_514;
  undefined4 local_504;
  double *local_500;
  undefined4 local_4f4;
  undefined4 local_4e4;
  double *local_4e0;
  undefined4 local_4d4;
  undefined4 local_4c4;
  undefined4 local_4b4;
  Box *local_498;
  Box *local_470;
  Box *local_448;
  Box *local_420;
  Box *local_3f8;
  Box *local_3d0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  long *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  long *local_398;
  int local_38c;
  int local_388;
  int local_384;
  long *local_380;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  int local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  long *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  long *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  long *local_290;
  int local_284;
  int local_280;
  int local_27c;
  long *local_278;
  int local_26c;
  int local_268;
  int local_264;
  long *local_260;
  int local_254;
  int local_250;
  int local_24c;
  long *local_248;
  int local_23c;
  int local_238;
  int local_234;
  long *local_230;
  int local_224;
  int local_220;
  int local_21c;
  long *local_218;
  int local_20c;
  int local_208;
  int local_204;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_194;
  int local_190;
  int local_18c;
  double *local_180;
  double *local_178;
  double *local_170;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  undefined4 local_ec;
  IntVect *local_e8;
  undefined4 local_dc;
  IntVect *local_d8;
  undefined4 local_cc;
  IntVect *local_c8;
  undefined4 local_bc;
  IntVect *local_b8;
  undefined4 local_ac;
  IntVect *local_a8;
  undefined4 local_9c;
  IntVect *local_98;
  undefined4 local_8c;
  Box *local_88;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  Box *local_48;
  undefined4 local_3c;
  Box *local_38;
  undefined4 local_2c;
  Box *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  Box *local_8;
  
  local_4b4 = 0;
  local_570 = 1.0 / *in_stack_00000010;
  local_4c4 = 1;
  local_578 = 1.0 / in_stack_00000010[1];
  local_4d4 = 2;
  local_580 = 1.0 / in_stack_00000010[2];
  local_568 = in_R9;
  local_560 = in_R8;
  local_558 = in_RCX;
  local_550 = in_RDX;
  local_548 = in_RSI;
  local_540 = in_RDI;
  Box::Box<double>(&in_stack_fffffffffffff740->m_b,in_stack_fffffffffffff738);
  Gpu::Range<amrex::Box>(&in_stack_fffffffffffff740->m_b);
  local_588 = local_5b0;
  Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_fffffffffffff740);
  Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_fffffffffffff740);
  while (bVar1 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                           (local_5e8,&local_600), bVar1) {
    Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_61c,local_5e8);
    local_6c = 0;
    local_7c = 1;
    local_628 = local_61c.smallend.vect[0];
    iStack_624 = local_61c.smallend.vect[1];
    local_8c = 2;
    local_f8 = &local_61c.bigend;
    local_fc = 0;
    local_108 = &local_61c.bigend;
    local_10c = 1;
    local_644 = CONCAT44(local_61c.bigend.vect[1],local_61c.bigend.vect[0]);
    local_118 = &local_61c.bigend;
    local_11c = 2;
    local_63c = local_61c.bigend.vect[2];
    local_448 = &local_61c;
    local_3d0 = &local_61c;
    local_88 = &local_61c;
    local_78 = &local_61c;
    local_68 = &local_61c;
    for (local_65c = local_61c.smallend.vect[2]; local_65c <= local_63c; local_65c = local_65c + 1)
    {
      for (local_660 = iStack_624; local_660 <= local_644._4_4_; local_660 = local_660 + 1) {
        for (local_664 = local_628; local_664 <= (int)local_644; local_664 = local_664 + 1) {
          local_338 = local_558;
          local_33c = local_664;
          local_340 = local_660;
          local_344 = local_65c;
          if (*(int *)(*local_558 +
                      ((long)(local_664 - (int)local_558[4]) +
                       (long)(local_660 - *(int *)((long)local_558 + 0x24)) * local_558[1] +
                      (long)(local_65c - (int)local_558[5]) * local_558[2]) * 4) == 0) {
            local_218 = local_540;
            local_21c = local_664;
            local_220 = local_660;
            local_224 = local_65c;
            *(undefined8 *)
             (*local_540 +
             ((long)(local_664 - (int)local_540[4]) +
              (long)(local_660 - *(int *)((long)local_540 + 0x24)) * local_540[1] +
             (long)(local_65c - (int)local_540[5]) * local_540[2]) * 8) = 0x3ff0000000000000;
          }
          else {
            local_350 = local_558;
            local_354 = local_664;
            local_358 = local_660;
            local_35c = local_65c;
            if (*(int *)(*local_558 +
                        ((long)(local_664 - (int)local_558[4]) +
                         (long)(local_660 - *(int *)((long)local_558 + 0x24)) * local_558[1] +
                        (long)(local_65c - (int)local_558[5]) * local_558[2]) * 4) == 1) {
              local_230 = local_540;
              local_234 = local_664;
              local_238 = local_660;
              local_23c = local_65c;
              *(undefined8 *)
               (*local_540 +
               ((long)(local_664 - (int)local_540[4]) +
                (long)(local_660 - *(int *)((long)local_540 + 0x24)) * local_540[1] +
               (long)(local_65c - (int)local_540[5]) * local_540[2]) * 8) = 0xbff0000000000000;
            }
            else {
              local_248 = local_540;
              local_24c = local_664;
              local_250 = local_660;
              local_254 = local_65c;
              local_4e0 = in_stack_00000018;
              local_4e4 = 0;
              local_4f4 = 0;
              local_670 = (*(double *)
                            (*local_540 +
                            ((long)(local_664 - (int)local_540[4]) +
                             (long)(local_660 - *(int *)((long)local_540 + 0x24)) * local_540[1] +
                            (long)(local_65c - (int)local_540[5]) * local_540[2]) * 8) -
                          ((double)local_664 * *in_stack_00000010 + *in_stack_00000018)) * 0.5 *
                          local_570;
              local_18c = local_664;
              local_190 = local_660;
              local_194 = local_65c;
              local_1a4 = local_664 + 1;
              local_1a8 = local_660;
              local_1ac = local_65c;
              if (*(double *)
                   (*in_stack_00000008 +
                   ((long)(local_664 - (int)in_stack_00000008[4]) +
                    (long)(local_660 - *(int *)((long)in_stack_00000008 + 0x24)) *
                    in_stack_00000008[1] +
                   (long)(local_65c - (int)in_stack_00000008[5]) * in_stack_00000008[2]) * 8) <
                  *(double *)
                   (*in_stack_00000008 +
                   ((long)(local_1a4 - (int)in_stack_00000008[4]) +
                    (long)(local_660 - *(int *)((long)in_stack_00000008 + 0x24)) *
                    in_stack_00000008[1] +
                   (long)(local_65c - (int)in_stack_00000008[5]) * in_stack_00000008[2]) * 8)) {
                local_670 = local_670 - 0.5;
              }
              local_678 = 0.5;
              local_680 = -0.5;
              local_128 = &local_680;
              local_130 = &local_670;
              local_160 = std::max<double>(local_128,local_130);
              local_158 = &local_678;
              pdVar2 = std::min<double>(local_158,local_160);
              local_260 = local_540;
              local_264 = local_664;
              local_268 = local_660;
              local_26c = local_65c;
              *(double *)
               (*local_540 +
               ((long)(local_664 - (int)local_540[4]) +
                (long)(local_660 - *(int *)((long)local_540 + 0x24)) * local_540[1] +
               (long)(local_65c - (int)local_540[5]) * local_540[2]) * 8) = *pdVar2;
            }
          }
        }
      }
    }
    Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(local_5e8);
  }
  Box::Box<double>(&in_stack_fffffffffffff740->m_b,in_stack_fffffffffffff738);
  Gpu::Range<amrex::Box>(&in_stack_fffffffffffff740->m_b);
  local_688 = local_6b0;
  Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_fffffffffffff740);
  Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_fffffffffffff740);
  while (bVar1 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                           (local_6e8,&local_700), bVar1) {
    Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_71c,local_6e8);
    local_3c = 0;
    local_4c = 1;
    local_728 = local_71c.smallend.vect[0];
    iStack_724 = local_71c.smallend.vect[1];
    local_5c = 2;
    local_c8 = &local_71c.bigend;
    local_cc = 0;
    local_d8 = &local_71c.bigend;
    local_dc = 1;
    local_744 = CONCAT44(local_71c.bigend.vect[1],local_71c.bigend.vect[0]);
    local_e8 = &local_71c.bigend;
    local_ec = 2;
    local_73c = local_71c.bigend.vect[2];
    local_470 = &local_71c;
    local_3f8 = &local_71c;
    local_58 = &local_71c;
    local_48 = &local_71c;
    local_38 = &local_71c;
    for (local_75c = local_71c.smallend.vect[2]; local_75c <= local_73c; local_75c = local_75c + 1)
    {
      for (local_760 = iStack_724; local_760 <= local_744._4_4_; local_760 = local_760 + 1) {
        for (local_764 = local_728; local_764 <= (int)local_744; local_764 = local_764 + 1) {
          local_368 = local_560;
          local_36c = local_764;
          local_370 = local_760;
          local_374 = local_75c;
          if (*(int *)(*local_560 +
                      ((long)(local_764 - (int)local_560[4]) +
                       (long)(local_760 - *(int *)((long)local_560 + 0x24)) * local_560[1] +
                      (long)(local_75c - (int)local_560[5]) * local_560[2]) * 4) == 0) {
            local_278 = local_548;
            local_27c = local_764;
            local_280 = local_760;
            local_284 = local_75c;
            *(undefined8 *)
             (*local_548 +
             ((long)(local_764 - (int)local_548[4]) +
              (long)(local_760 - *(int *)((long)local_548 + 0x24)) * local_548[1] +
             (long)(local_75c - (int)local_548[5]) * local_548[2]) * 8) = 0x3ff0000000000000;
          }
          else {
            local_380 = local_560;
            local_384 = local_764;
            local_388 = local_760;
            local_38c = local_75c;
            if (*(int *)(*local_560 +
                        ((long)(local_764 - (int)local_560[4]) +
                         (long)(local_760 - *(int *)((long)local_560 + 0x24)) * local_560[1] +
                        (long)(local_75c - (int)local_560[5]) * local_560[2]) * 4) == 1) {
              local_290 = local_548;
              local_294 = local_764;
              local_298 = local_760;
              local_29c = local_75c;
              *(undefined8 *)
               (*local_548 +
               ((long)(local_764 - (int)local_548[4]) +
                (long)(local_760 - *(int *)((long)local_548 + 0x24)) * local_548[1] +
               (long)(local_75c - (int)local_548[5]) * local_548[2]) * 8) = 0xbff0000000000000;
            }
            else {
              local_2a8 = local_548;
              local_2ac = local_764;
              local_2b0 = local_760;
              local_2b4 = local_75c;
              local_500 = in_stack_00000018;
              local_504 = 1;
              local_514 = 1;
              local_770 = (*(double *)
                            (*local_548 +
                            ((long)(local_764 - (int)local_548[4]) +
                             (long)(local_760 - *(int *)((long)local_548 + 0x24)) * local_548[1] +
                            (long)(local_75c - (int)local_548[5]) * local_548[2]) * 8) -
                          ((double)local_760 * in_stack_00000010[1] + in_stack_00000018[1])) * 0.5 *
                          local_578;
              local_1bc = local_764;
              local_1c0 = local_760;
              local_1c4 = local_75c;
              local_1d8 = local_760 + 1;
              local_1d4 = local_764;
              local_1dc = local_75c;
              if (*(double *)
                   (*in_stack_00000008 +
                   ((long)(local_764 - (int)in_stack_00000008[4]) +
                    (long)(local_760 - *(int *)((long)in_stack_00000008 + 0x24)) *
                    in_stack_00000008[1] +
                   (long)(local_75c - (int)in_stack_00000008[5]) * in_stack_00000008[2]) * 8) <
                  *(double *)
                   (*in_stack_00000008 +
                   ((long)(local_764 - (int)in_stack_00000008[4]) +
                    (long)(local_1d8 - *(int *)((long)in_stack_00000008 + 0x24)) *
                    in_stack_00000008[1] +
                   (long)(local_75c - (int)in_stack_00000008[5]) * in_stack_00000008[2]) * 8)) {
                local_770 = local_770 - 0.5;
              }
              local_778 = 0.5;
              local_780 = -0.5;
              local_138 = &local_780;
              local_140 = &local_770;
              local_170 = std::max<double>(local_138,local_140);
              local_168 = &local_778;
              pdVar2 = std::min<double>(local_168,local_170);
              local_2c0 = local_548;
              local_2c4 = local_764;
              local_2c8 = local_760;
              local_2cc = local_75c;
              *(double *)
               (*local_548 +
               ((long)(local_764 - (int)local_548[4]) +
                (long)(local_760 - *(int *)((long)local_548 + 0x24)) * local_548[1] +
               (long)(local_75c - (int)local_548[5]) * local_548[2]) * 8) = *pdVar2;
            }
          }
        }
      }
    }
    Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(local_6e8);
  }
  Box::Box<double>(&in_stack_fffffffffffff740->m_b,in_stack_fffffffffffff738);
  Gpu::Range<amrex::Box>(&in_stack_fffffffffffff740->m_b);
  local_788 = local_7b0;
  Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_fffffffffffff740);
  Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_fffffffffffff740);
  while (bVar1 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                           (local_7e8,&local_800), bVar1) {
    Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_81c,local_7e8);
    local_c = 0;
    local_1c = 1;
    local_828 = local_81c.smallend.vect[0];
    iStack_824 = local_81c.smallend.vect[1];
    local_2c = 2;
    local_98 = &local_81c.bigend;
    local_9c = 0;
    local_a8 = &local_81c.bigend;
    local_ac = 1;
    local_844 = CONCAT44(local_81c.bigend.vect[1],local_81c.bigend.vect[0]);
    local_b8 = &local_81c.bigend;
    local_bc = 2;
    local_83c = local_81c.bigend.vect[2];
    local_498 = &local_81c;
    local_420 = &local_81c;
    local_28 = &local_81c;
    local_18 = &local_81c;
    local_8 = &local_81c;
    for (local_85c = local_81c.smallend.vect[2]; local_85c <= local_83c; local_85c = local_85c + 1)
    {
      for (local_860 = iStack_824; local_860 <= local_844._4_4_; local_860 = local_860 + 1) {
        for (local_864 = local_828; local_864 <= (int)local_844; local_864 = local_864 + 1) {
          local_398 = local_568;
          local_39c = local_864;
          local_3a0 = local_860;
          local_3a4 = local_85c;
          if (*(int *)(*local_568 +
                      ((long)(local_864 - (int)local_568[4]) +
                       (long)(local_860 - *(int *)((long)local_568 + 0x24)) * local_568[1] +
                      (long)(local_85c - (int)local_568[5]) * local_568[2]) * 4) == 0) {
            local_2d8 = local_550;
            local_2dc = local_864;
            local_2e0 = local_860;
            local_2e4 = local_85c;
            *(undefined8 *)
             (*local_550 +
             ((long)(local_864 - (int)local_550[4]) +
              (long)(local_860 - *(int *)((long)local_550 + 0x24)) * local_550[1] +
             (long)(local_85c - (int)local_550[5]) * local_550[2]) * 8) = 0x3ff0000000000000;
          }
          else {
            local_3b0 = local_568;
            local_3b4 = local_864;
            local_3b8 = local_860;
            local_3bc = local_85c;
            if (*(int *)(*local_568 +
                        ((long)(local_864 - (int)local_568[4]) +
                         (long)(local_860 - *(int *)((long)local_568 + 0x24)) * local_568[1] +
                        (long)(local_85c - (int)local_568[5]) * local_568[2]) * 4) == 1) {
              local_2f0 = local_550;
              local_2f4 = local_864;
              local_2f8 = local_860;
              local_2fc = local_85c;
              *(undefined8 *)
               (*local_550 +
               ((long)(local_864 - (int)local_550[4]) +
                (long)(local_860 - *(int *)((long)local_550 + 0x24)) * local_550[1] +
               (long)(local_85c - (int)local_550[5]) * local_550[2]) * 8) = 0xbff0000000000000;
            }
            else {
              local_308 = local_550;
              local_30c = local_864;
              local_310 = local_860;
              local_314 = local_85c;
              local_520 = in_stack_00000018;
              local_524 = 2;
              local_534 = 2;
              local_870 = (*(double *)
                            (*local_550 +
                            ((long)(local_864 - (int)local_550[4]) +
                             (long)(local_860 - *(int *)((long)local_550 + 0x24)) * local_550[1] +
                            (long)(local_85c - (int)local_550[5]) * local_550[2]) * 8) -
                          ((double)local_85c * in_stack_00000010[2] + in_stack_00000018[2])) * 0.5 *
                          local_580;
              local_1ec = local_864;
              local_1f0 = local_860;
              local_1f4 = local_85c;
              local_20c = local_85c + 1;
              local_204 = local_864;
              local_208 = local_860;
              if (*(double *)
                   (*in_stack_00000008 +
                   ((long)(local_864 - (int)in_stack_00000008[4]) +
                    (long)(local_860 - *(int *)((long)in_stack_00000008 + 0x24)) *
                    in_stack_00000008[1] +
                   (long)(local_85c - (int)in_stack_00000008[5]) * in_stack_00000008[2]) * 8) <
                  *(double *)
                   (*in_stack_00000008 +
                   ((long)(local_864 - (int)in_stack_00000008[4]) +
                    (long)(local_860 - *(int *)((long)in_stack_00000008 + 0x24)) *
                    in_stack_00000008[1] +
                   (long)(local_20c - (int)in_stack_00000008[5]) * in_stack_00000008[2]) * 8)) {
                local_870 = local_870 - 0.5;
              }
              local_878 = 0.5;
              local_880 = -0.5;
              local_148 = &local_880;
              local_150 = &local_870;
              local_180 = std::max<double>(local_148,local_150);
              local_178 = &local_878;
              pdVar2 = std::min<double>(local_178,local_180);
              local_320 = local_550;
              local_324 = local_864;
              local_328 = local_860;
              local_32c = local_85c;
              *(double *)
               (*local_550 +
               ((long)(local_864 - (int)local_550[4]) +
                (long)(local_860 - *(int *)((long)local_550 + 0x24)) * local_550[1] +
               (long)(local_85c - (int)local_550[5]) * local_550[2]) * 8) = *pdVar2;
            }
          }
        }
      }
    }
    Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(local_7e8);
  }
  return;
}

Assistant:

void intercept_to_edge_centroid (AMREX_D_DECL(Array4<Real> const& excent,
                                              Array4<Real> const& eycent,
                                              Array4<Real> const& ezcent),
                                 AMREX_D_DECL(Array4<Type_t const> const& fx,
                                              Array4<Type_t const> const& fy,
                                              Array4<Type_t const> const& fz),
                                 Array4<Real const> const& levset,
                                 GpuArray<Real,AMREX_SPACEDIM> const& dx,
                                 GpuArray<Real,AMREX_SPACEDIM> const& problo) noexcept
{
    AMREX_D_TERM(const Real dxinv = Real(1.0)/dx[0];,
                 const Real dyinv = Real(1.0)/dx[1];,
                 const Real dzinv = Real(1.0)/dx[2];)
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
        Box(excent), xbx, {
            AMREX_LOOP_3D(xbx, i, j, k, {
                if (fx(i,j,k) == Type::regular) {
                    excent(i,j,k) = Real(1.0);
                } else if (fx(i,j,k) == Type::covered) {
                    excent(i,j,k) = Real(-1.0);
                } else {
                    Real xcut = Real(0.5)*(excent(i,j,k) - (problo[0]+i*dx[0]))*dxinv;
                    if (levset(i,j,k) < levset(i+1,j,k)) { // right side covered
                        xcut -= Real(0.5);
                    }
                    excent(i,j,k) = amrex::min(Real(0.5),amrex::max(Real(-0.5),xcut));
                }